

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall
hwtest::pgraph::MthdRankineClipPlaneEnable::emulate_mthd(MthdRankineClipPlaneEnable *this)

{
  _Bool _Var1;
  int local_18;
  uint32_t local_14;
  int i;
  uint32_t err;
  MthdRankineClipPlaneEnable *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  _Var1 = pgraph_in_begin_end(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var1) {
    local_14 = 4;
  }
  if (local_14 == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_clip_plane_enable =
           (this->super_SingleMthdTest).super_MthdTest.val & 0x333333;
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x56,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.
                    bundle_clip_plane_enable,true);
      for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
        (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_c =
             (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.xf_mode_c &
             ((uint)(1L << ((byte)local_18 & 0x3f)) ^ 0xffffffff) |
             (uint)(((ulong)(this->super_SingleMthdTest).super_MthdTest.val <<
                    (0x3eU - (char)(local_18 << 2) & 0x3f)) >> 0x3e != 0) << ((byte)local_18 & 0x3f)
        ;
      }
      pgraph_flush_xf_mode(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				exp.bundle_clip_plane_enable = val & 0x333333;
				pgraph_bundle(&exp, BUNDLE_CLIP_PLANE_ENABLE, 0, exp.bundle_clip_plane_enable, true);
				for (int i = 0; i < 6; i++)
					insrt(exp.xf_mode_c, i, 1, extr(val, i*4, 2) != 0);
				pgraph_flush_xf_mode(&exp);
			}
		}
	}